

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O2

CommPtr __thiscall Omega_h::Comm::graph_inverse(Comm *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Read<int> *in_RSI;
  CommPtr CVar1;
  Write<int> local_30;
  Write<int> local_20;
  
  Write<int>::Write(&local_20,(Write<int> *)&in_RSI[1].write_.shared_alloc_.direct_ptr);
  Write<int>::Write(&local_30,(Write<int> *)&(in_RSI->write_).shared_alloc_.direct_ptr);
  graph_adjacent(this,in_RSI,(Read<int> *)&local_20);
  Write<int>::~Write(&local_30);
  Write<int>::~Write(&local_20);
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph_inverse() const {
  return graph_adjacent(destinations(), sources());
}